

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# taggedptr.h
# Opt level: O0

LightLeSample * __thiscall
pbrt::detail::DispatchSplit<4>::operator()
          (void *param_1,undefined8 param_2,
          TaggedPointer<pbrt::PointLight,_pbrt::DistantLight,_pbrt::ProjectionLight,_pbrt::GoniometricLight,_pbrt::SpotLight,_pbrt::DiffuseAreaLight,_pbrt::UniformInfiniteLight,_pbrt::ImageInfiniteLight,_pbrt::PortalImageInfiniteLight>
          *param_3,int param_4,undefined8 param_5,undefined8 param_6,undefined8 param_7,
          undefined8 param_8,undefined8 param_9,undefined8 param_10)

{
  int mid;
  TaggedPointer<pbrt::PointLight,_pbrt::DistantLight,_pbrt::ProjectionLight,_pbrt::GoniometricLight,_pbrt::SpotLight,_pbrt::DiffuseAreaLight,_pbrt::UniformInfiniteLight,_pbrt::ImageInfiniteLight,_pbrt::PortalImageInfiniteLight>
  local_88;
  undefined8 local_80;
  undefined8 local_78;
  undefined8 local_70;
  undefined8 local_68;
  undefined1 local_5a [2];
  TaggedPointer<pbrt::PointLight,_pbrt::DistantLight,_pbrt::ProjectionLight,_pbrt::GoniometricLight,_pbrt::SpotLight,_pbrt::DiffuseAreaLight,_pbrt::UniformInfiniteLight,_pbrt::ImageInfiniteLight,_pbrt::PortalImageInfiniteLight>
  local_58;
  undefined8 local_50;
  undefined8 local_48;
  undefined8 local_40;
  undefined8 local_38;
  undefined1 local_29;
  undefined4 local_28;
  int local_24;
  TaggedPointer<pbrt::PointLight,_pbrt::DistantLight,_pbrt::ProjectionLight,_pbrt::GoniometricLight,_pbrt::SpotLight,_pbrt::DiffuseAreaLight,_pbrt::UniformInfiniteLight,_pbrt::ImageInfiniteLight,_pbrt::PortalImageInfiniteLight>
  *local_20;
  undefined8 local_18;
  void *local_8;
  
  local_28 = 2;
  local_24 = param_4;
  local_20 = param_3;
  local_18 = param_2;
  local_8 = param_1;
  if (param_4 + -1 < 2) {
    local_50 = param_7;
    local_48 = param_8;
    local_40 = param_9;
    local_38 = param_10;
    TaggedPointer<pbrt::PointLight,_pbrt::DistantLight,_pbrt::ProjectionLight,_pbrt::GoniometricLight,_pbrt::SpotLight,_pbrt::DiffuseAreaLight,_pbrt::UniformInfiniteLight,_pbrt::ImageInfiniteLight,_pbrt::PortalImageInfiniteLight>
    ::TaggedPointer(&local_58,param_3);
    DispatchSplit<2>::operator()
              ((DispatchSplit<2> *)param_1,&local_29,&local_58,local_24,local_40,param_6,local_50,
               local_48,local_40,local_38);
  }
  else {
    local_80 = param_7;
    local_78 = param_8;
    local_70 = param_9;
    local_68 = param_10;
    TaggedPointer<pbrt::PointLight,_pbrt::DistantLight,_pbrt::ProjectionLight,_pbrt::GoniometricLight,_pbrt::SpotLight,_pbrt::DiffuseAreaLight,_pbrt::UniformInfiniteLight,_pbrt::ImageInfiniteLight,_pbrt::PortalImageInfiniteLight>
    ::TaggedPointer(&local_88,param_3);
    DispatchSplit<2>::operator()
              ((DispatchSplit<2> *)param_1,local_5a,&local_88,local_24 + -2,local_70,param_6,
               local_80,local_78,local_70,local_68);
  }
  return (LightLeSample *)param_1;
}

Assistant:

PBRT_CPU_GPU inline auto operator()(F func, Tp tp, int tag, TypePack<Ts...> types) {
        constexpr int mid = n / 2;

        if (tag - 1 < mid)  // 0-based indexing here to be more traditional
            return DispatchSplit<mid>()(
                func, tp, tag, typename TakeFirstN<mid, TypePack<Ts...>>::type());
        else
            return DispatchSplit<n - mid>()(
                func, tp, tag - mid, typename RemoveFirstN<mid, TypePack<Ts...>>::type());
    }